

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

input_type __thiscall MODEL3D::three_dim_model::hash_prop(three_dim_model *this,string *inString)

{
  bool bVar1;
  string *inString_local;
  three_dim_model *this_local;
  
  bVar1 = std::operator==(inString,"Number");
  if (bVar1) {
    this_local._4_4_ = eNumber;
  }
  else {
    bVar1 = std::operator==(inString,"Name");
    if (bVar1) {
      this_local._4_4_ = eName;
    }
    else {
      bVar1 = std::operator==(inString,"MaskType");
      if (bVar1) {
        this_local._4_4_ = eMask_type;
      }
      else {
        bVar1 = std::operator==(inString,"ZStart");
        if (bVar1) {
          this_local._4_4_ = eZ_Start;
        }
        else {
          bVar1 = std::operator==(inString,"Thickness");
          if (bVar1) {
            this_local._4_4_ = eThickness;
          }
          else {
            bVar1 = std::operator==(inString,"Material");
            if (bVar1) {
              this_local._4_4_ = eMaterial;
            }
            else {
              bVar1 = std::operator==(inString,"$End");
              if (bVar1) {
                this_local._4_4_ = eError;
              }
              else {
                this_local._4_4_ = eDefault;
              }
            }
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

MODEL3D::input_type MODEL3D::three_dim_model::hash_prop(std::string const& inString)
{
    if(inString == "Number") return eNumber;
    if(inString == "Name") return eName;
    if(inString == "MaskType") return eMask_type;
    if(inString == "ZStart") return eZ_Start;
    if(inString == "Thickness") return eThickness;
    if(inString == "Material") return eMaterial;
    if(inString == "$End") return eError;
    return eDefault;
}